

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,int fmt)

{
  char *pcVar1;
  undefined1 local_28 [8];
  printbuffer p;
  int fmt_local;
  int prebuffer_local;
  cJSON *item_local;
  
  p.length = fmt;
  p.offset = prebuffer;
  local_28 = (undefined1  [8])(*cJSON_malloc)((long)prebuffer);
  p.buffer._0_4_ = p.offset;
  p.buffer._4_4_ = 0;
  pcVar1 = print_value(item,0,p.length,(printbuffer *)local_28);
  return pcVar1;
}

Assistant:

char *cJSON_PrintBuffered(cJSON *item,int prebuffer,int fmt)
{
	printbuffer p;
	p.buffer=(char*)cJSON_malloc(prebuffer);
	p.length=prebuffer;
	p.offset=0;
	return print_value(item,0,fmt,&p);
	return p.buffer;
}